

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

bool __thiscall wabt::anon_unknown_24::BinaryReader::IsConcreteType(BinaryReader *this,Type type)

{
  undefined1 uVar1;
  
  if (type.enum_ < F64) {
    if (2 < (uint)(type.enum_ + 0x12)) {
      if (type.enum_ == Exnref) {
        if (*(char *)((long)&(this->state_).data + 1) == '\x01') {
          return (bool)(char)this->read_end_;
        }
      }
      else if (type.enum_ == V128) {
        return (bool)*(undefined1 *)((long)&this->read_end_ + 4);
      }
      return false;
    }
    uVar1 = *(undefined1 *)((long)&(this->state_).data + 1);
  }
  else {
    uVar1 = 1;
    if (3 < (uint)(type.enum_ + I8U)) {
      return false;
    }
  }
  return (bool)uVar1;
}

Assistant:

bool BinaryReader::IsConcreteType(Type type) {
  switch (type) {
    case Type::I32:
    case Type::I64:
    case Type::F32:
    case Type::F64:
      return true;

    case Type::V128:
      return options_.features.simd_enabled();

    case Type::Funcref:
    case Type::Anyref:
    case Type::Nullref:
      return options_.features.reference_types_enabled();

    case Type::Exnref:
      return options_.features.reference_types_enabled() &&
             options_.features.exceptions_enabled();

    default:
      return false;
  }
}